

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_singleton.h
# Opt level: O1

object_t<_zes_perf_handle_t_*> * __thiscall
singleton_factory_t<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*>::
getInstance<_zes_perf_handle_t*&,dditable_t*&>
          (singleton_factory_t<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*> *this,
          _zes_perf_handle_t **_params,dditable_t **_params_1)

{
  long *plVar1;
  dditable_t *pdVar2;
  int iVar3;
  undefined8 *puVar4;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
  _Var5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  object_t<_zes_perf_handle_t_*> *poVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false,_false>,_bool>
  pVar10;
  __single_object ptr;
  key_t key;
  _zes_perf_handle_t *local_28;
  
  local_28 = *_params;
  if (local_28 == (_zes_perf_handle_t *)0x0) {
    poVar9 = (object_t<_zes_perf_handle_t_*> *)0x0;
  }
  else {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    uVar6 = (ulong)local_28 % *(ulong *)(this + 0x30);
    plVar7 = *(long **)(*(long *)(this + 0x28) + uVar6 * 8);
    plVar8 = (long *)0x0;
    if ((plVar7 != (long *)0x0) &&
       (plVar1 = (long *)*plVar7, plVar8 = plVar7,
       local_28 != (_zes_perf_handle_t *)((long *)*plVar7)[1])) {
      while (plVar7 = plVar1, plVar1 = (long *)*plVar7, plVar1 != (long *)0x0) {
        plVar8 = (long *)0x0;
        if (((ulong)plVar1[1] % *(ulong *)(this + 0x30) != uVar6) ||
           (plVar8 = plVar7, local_28 == (_zes_perf_handle_t *)plVar1[1])) goto LAB_001c38c0;
      }
      plVar8 = (long *)0x0;
    }
LAB_001c38c0:
    if (plVar8 == (long *)0x0) {
      _Var5._M_cur = (__node_type *)0x0;
    }
    else {
      _Var5._M_cur = (__node_type *)*plVar8;
    }
    if (_Var5._M_cur == (__node_type *)0x0) {
      puVar4 = (undefined8 *)operator_new(0x10);
      pdVar2 = *_params_1;
      *puVar4 = *_params;
      puVar4[1] = pdVar2;
      pVar10 = std::
               _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<unsigned_long&,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>
                         ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)(this + 0x28),&local_28);
      _Var5._M_cur = (__node_type *)
                     pVar10.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
                     ._M_cur;
      if (puVar4 != (undefined8 *)0x0) {
        operator_delete(puVar4,0x10);
      }
    }
    poVar9 = *(object_t<_zes_perf_handle_t_*> **)
              ((long)&((_Var5._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>
                      ._M_storage._M_storage + 8);
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  return poVar9;
}

Assistant:

_singleton_t* getInstance( Ts&&... _params )
    {
        auto key = getKey( std::forward<Ts>( _params )... );

        if(key == 0) // No zero keys allowed in map
            return static_cast<_singleton_t*>(0);

        std::lock_guard<std::mutex> lk( mut );
        auto iter = map.find( key );

        if( map.end() == iter )
        {
            auto ptr = std::make_unique<singleton_t>( std::forward<Ts>( _params )... );
            iter = map.emplace( key, std::move( ptr ) ).first;
        }
        return iter->second.get();
    }